

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

void __thiscall Logging::saveLog(Logging *this)

{
  pointer pdVar1;
  long lVar2;
  ostream *poVar3;
  int i_1;
  int i;
  ulong uVar4;
  uint __val;
  string sStack_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ofstream outfile;
  
  std::ofstream::ofstream(&outfile);
  lVar2 = std::chrono::_V2::system_clock::now();
  currentDateTime_abi_cxx11_();
  std::operator+(&local_2a8,"/home/haukur/MasterProject/Logs/value_",&local_2c8);
  std::operator+(&local_288,&local_2a8,"_");
  __val = (uint)(lVar2 / 1000000);
  std::__cxx11::to_string(&sStack_2e8,__val);
  std::operator+(&local_268,&local_288,&sStack_2e8);
  std::operator+(&local_248,&local_268,".csv");
  std::ofstream::open((string *)&outfile,(_Ios_Openmode)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&sStack_2e8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  poVar3 = std::operator<<((ostream *)&outfile,"time,populationID,neuronID,valueType,value");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (uVar4 = 0;
      pdVar1 = (this->value_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->value_time).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar4 = uVar4 + 1) {
    poVar3 = std::ostream::_M_insert<double>(pdVar1[uVar4]);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(this->value_neuronID).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar4]);
    std::operator<<(poVar3,",");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&outfile,
                        (this->value_valueType).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar4]);
    std::operator<<(poVar3,",");
    poVar3 = std::ostream::_M_insert<double>
                       ((this->value_value).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar4]);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::ofstream::close();
  currentDateTime_abi_cxx11_();
  std::operator+(&local_2a8,"/home/haukur/MasterProject/Logs/event_",&local_2c8);
  std::operator+(&local_288,&local_2a8,"_");
  std::__cxx11::to_string(&sStack_2e8,__val);
  std::operator+(&local_268,&local_288,&sStack_2e8);
  std::operator+(&local_248,&local_268,".csv");
  std::ofstream::open((string *)&outfile,(_Ios_Openmode)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&sStack_2e8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  poVar3 = std::operator<<((ostream *)&outfile,"time,populationID,neuronID,eventType");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (uVar4 = 0;
      pdVar1 = (this->event_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->event_time).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar4 = uVar4 + 1) {
    poVar3 = std::ostream::_M_insert<double>(pdVar1[uVar4]);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(this->event_neuronID).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar4]);
    std::operator<<(poVar3,",");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&outfile,
                        (this->event_eventType).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar4]);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&outfile);
  return;
}

Assistant:

void Logging::saveLog() {
    ofstream outfile;
    unsigned int timeSinceEpoch = std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now().time_since_epoch()).count();
    outfile.open("/home/haukur/MasterProject/Logs/value_" + currentDateTime() + "_" + to_string(timeSinceEpoch) + ".csv");
    outfile << "time,populationID,neuronID,valueType,value" << endl;
    for(int i = 0; i < value_time.size(); i++) {
        outfile << value_time[i] << "," << value_populationID[i] << "," << value_neuronID[i] << ",";
        outfile << value_valueType[i] << "," << value_value[i] << endl;
    }
    outfile.close();
    outfile.open("/home/haukur/MasterProject/Logs/event_" + currentDateTime() + "_" + to_string(timeSinceEpoch) + ".csv");
    outfile << "time,populationID,neuronID,eventType" << endl;
    for(int i = 0; i < event_time.size(); i++) {
        outfile << event_time[i] << "," << event_populationID[i] << "," << event_neuronID[i] << ",";
        outfile << event_eventType[i] << endl;
    }
    outfile.close();
}